

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.h
# Opt level: O1

void __thiscall
TPZMatrixSolver<std::complex<float>_>::SetMatrix
          (TPZMatrixSolver<std::complex<float>_> *this,TPZAutoPointer<TPZBaseMatrix> *Refmat)

{
  TPZAutoPointer<TPZBaseMatrix> TStack_18;
  TPZAutoPointer<TPZBaseMatrix> local_10;
  
  local_10 = (TPZAutoPointer<TPZBaseMatrix>)Refmat->fRef;
  LOCK();
  ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZAutoPointerDynamicCast<TPZMatrix<std::complex<float>>,TPZBaseMatrix>(&TStack_18);
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator=
            (&this->fContainer,(TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)&TStack_18);
  TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *)&TStack_18);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_10);
  return;
}

Assistant:

virtual void SetMatrix(TPZAutoPointer<TPZBaseMatrix> Refmat)
    {
        fContainer = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(Refmat);
    }